

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_octet_string(uchar **p,uchar *start,uchar *buf,size_t size)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t len;
  
  puVar1 = *p;
  len = 0xffffff94;
  if (size <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -size;
    memcpy(puVar1 + -size,buf,size);
    len = size & 0xffffffff;
  }
  iVar4 = (int)len;
  iVar3 = iVar4;
  if ((-1 < iVar4) && (iVar2 = mbedtls_asn1_write_len(p,start,len), iVar3 = iVar2, -1 < iVar2)) {
    puVar1 = *p;
    if ((long)puVar1 - (long)start < 1) {
      iVar3 = -0x6c;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = '\x04';
      iVar3 = 1;
    }
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      iVar3 = iVar2 + iVar4 + iVar3;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_write_octet_string( unsigned char **p, unsigned char *start,
                             const unsigned char *buf, size_t size )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start, buf, size ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_OCTET_STRING ) );

    return( (int) len );
}